

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferDataCase::init
          (ModifyAfterWithBufferDataCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  ModifyAfterWithBufferDataCase *extraout_RAX;
  EVP_PKEY_CTX *ctx_00;
  value_type_conflict5 local_4ad;
  deInt32 local_4ac;
  char *pcStack_4a8;
  int largerBufferSize;
  MessageBuilder local_4a0;
  MessageBuilder local_320;
  int local_1a0 [4];
  MessageBuilder local_190;
  ModifyAfterWithBufferDataCase *local_10;
  ModifyAfterWithBufferDataCase *this_local;
  
  local_10 = this;
  if ((this->m_repeatedUpload & 1U) == 0) {
    pTVar1 = tcu::TestContext::getLog
                       ((this->
                        super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ).
                        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_320,
                        (char (*) [107])
                        "Testing performance of BufferData() command after a draw command that sources data from the target buffer."
                       );
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
  }
  else {
    pTVar1 = tcu::TestContext::getLog
                       ((this->
                        super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ).
                        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_190,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_190,
                        (char (*) [116])
                        "Testing performance of BufferData() command after \"specify buffer contents - draw buffer\" command pair is repeated "
                       );
    local_1a0[0] = 2;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1a0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])" times.");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  pTVar1 = tcu::TestContext::getLog
                     ((this->
                      super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_4a0,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pcStack_4a8 = "Buffer contents are modified with BufferData().\n";
  if ((this->m_respecifySize & 1U) != 0) {
    pcStack_4a8 = "Buffer size is increased and contents are modified with BufferData().\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(&local_4a0,&stack0xfffffffffffffb58);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4a0);
  ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
  init(&this->
        super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
       ,ctx_00);
  if ((this->m_respecifySize & 1U) != 0) {
    local_4ac = deAlign32((int)((float)(this->
                                       super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                                       ).
                                       super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                                       .m_bufferSizeMax * this->m_sizeDifferenceFactor),0x10);
    local_4ad = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&(this->
                super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                ).m_zeroData,(long)local_4ac,&local_4ad);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void ModifyAfterWithBufferDataCase::init (void)
{
	// Log the purpose of the test

	if (m_repeatedUpload)
		m_testCtx.getLog() << tcu::TestLog::Message << "Testing performance of BufferData() command after \"specify buffer contents - draw buffer\" command pair is repeated " << (int)NUM_REPEATS << " times." << tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Testing performance of BufferData() command after a draw command that sources data from the target buffer." << tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< ((m_respecifySize) ?
			("Buffer size is increased and contents are modified with BufferData().\n") :
			("Buffer contents are modified with BufferData().\n"))
		<< tcu::TestLog::EndMessage;

	// init parent
	ModifyAfterBasicCase<SingleOperationDuration>::init();

	// make sure our zeroBuffer is large enough
	if (m_respecifySize)
	{
		const int largerBufferSize = deAlign32((int)((float)m_bufferSizeMax * m_sizeDifferenceFactor), 4*4);
		m_zeroData.resize(largerBufferSize, 0x00);
	}
}